

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::internal::ReturnAction<ot::commissioner::Error>::
Impl<ot::commissioner::Error,_ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
::Impl(Impl<ot::commissioner::Error,_ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
       *this,shared_ptr<ot::commissioner::Error> *value)

{
  element_type *aError;
  Error local_50;
  __shared_ptr_access<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  shared_ptr<ot::commissioner::Error> *value_local;
  Impl<ot::commissioner::Error,_ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *this_local;
  
  local_18 = (__shared_ptr_access<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)value;
  value_local = (shared_ptr<ot::commissioner::Error> *)this;
  ActionInterface<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  ::ActionInterface(&this->
                     super_ActionInterface<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                   );
  (this->
  super_ActionInterface<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  )._vptr_ActionInterface = (_func_int **)&PTR__Impl_004aa880;
  aError = std::
           __shared_ptr_access<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(local_18);
  ot::commissioner::Error::Error(&this->value_before_cast_,aError);
  ot::commissioner::Error::Error(&local_50,&this->value_before_cast_);
  ImplicitCast_<ot::commissioner::Error>(&this->value_,&local_50);
  ot::commissioner::Error::~Error(&local_50);
  return;
}

Assistant:

explicit Impl(const std::shared_ptr<R>& value)
        : value_before_cast_(*value),
          value_(ImplicitCast_<Result>(value_before_cast_)) {}